

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

void __thiscall
jbcoin::STObject::STObject(STObject *this,SOTemplate *type,SerialIter *sit,SField *name)

{
  size_t __n;
  SField *name_local;
  SerialIter *sit_local;
  SOTemplate *type_local;
  STObject *this_local;
  
  STBase::STBase(&this->super_STBase,name);
  CountedObject<jbcoin::STObject>::CountedObject((CountedObject<jbcoin::STObject> *)this);
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STObject_0051a068;
  std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::vector(&this->v_);
  __n = SOTemplate::size(type);
  std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::reserve(&this->v_,__n)
  ;
  set(this,sit,0);
  setType(this,type);
  return;
}

Assistant:

STObject::STObject (SOTemplate const& type,
        SerialIter & sit, SField const& name)
    : STBase (name)
{
    v_.reserve(type.size());
    set (sit);
    setType (type);
}